

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler_test.cc
# Opt level: O3

void ADTestTest(int n)

{
  undefined1 auVar1 [16];
  double *random_sample;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  string local_50;
  double local_30;
  
  uVar4 = (ulong)n;
  uVar3 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar3 = uVar4 * 8;
  }
  random_sample = (double *)operator_new__(uVar3);
  auVar1 = _DAT_0013d230;
  if (0 < n) {
    lVar2 = (ulong)(uint)n - 1;
    auVar5._8_4_ = (int)lVar2;
    auVar5._0_8_ = lVar2;
    auVar5._12_4_ = (int)((ulong)lVar2 >> 0x20);
    uVar3 = 0;
    auVar5 = auVar5 ^ _DAT_0013d230;
    auVar6 = _DAT_0013d220;
    do {
      auVar7 = auVar6 ^ auVar1;
      if ((bool)(~(auVar7._4_4_ == auVar5._4_4_ && auVar5._0_4_ < auVar7._0_4_ ||
                  auVar5._4_4_ < auVar7._4_4_) & 1)) {
        random_sample[uVar3] = ((double)(int)uVar3 + 0.01) / (double)n;
      }
      if ((auVar7._12_4_ != auVar5._12_4_ || auVar7._8_4_ <= auVar5._8_4_) &&
          auVar7._12_4_ <= auVar5._12_4_) {
        random_sample[uVar3 + 1] = ((double)((int)uVar3 + 1) + 0.01) / (double)n;
      }
      uVar3 = uVar3 + 2;
      lVar2 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar2 + 2;
    } while ((n + 1U & 0xfffffffe) != uVar3);
  }
  if (n != 0) {
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::__introsort_loop<double*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (random_sample,random_sample + uVar4,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<double*,__gnu_cxx::__ops::_Iter_less_iter>
              (random_sample,random_sample + uVar4);
  }
  local_30 = AndersonDarlingStatistic(n,random_sample);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  StringPrintf_abi_cxx11_
            (&local_50,"Testing the AD test. n=%d, ad_stat = %f",local_30,(ulong)(uint)n);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,local_50._M_dataplus._M_p,local_50._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  operator_delete__(random_sample);
  return;
}

Assistant:

void ADTestTest(int n) {
  std::unique_ptr<double[]> random_sample(new double[n]);
  for (int i = 0; i < n; i++) {
    random_sample[i] = (i+0.01)/n;
  }
  std::sort(random_sample.get(), random_sample.get() + n);
  double ad_stat = AndersonDarlingStatistic(n, random_sample.get());
  LOG(INFO) << StringPrintf("Testing the AD test. n=%d, ad_stat = %f",
                            n, ad_stat);
}